

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_reboot(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  byte bVar4;
  AREA_DATA_conflict *pAVar5;
  basic_string_view<char> format;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  string area;
  char arg1 [4608];
  char send [4608];
  CHAR_DATA *in_stack_ffffffffffffd918;
  long *local_26d8 [2];
  long local_26c8 [2];
  long *local_26b8 [2];
  long local_26a8 [2];
  char *local_2698;
  CHAR_DATA *local_2690;
  char *local_2688 [3];
  buffer<char> local_2670;
  char local_2650 [504];
  char local_2458 [4608];
  char local_1258 [4648];
  
  pcVar3 = one_argument(argument,local_2458);
  iVar2 = atoi(local_2458);
  local_26d8[0] = local_26c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_26d8,"");
  if (area_first == (AREA_DATA_conflict *)0x0) {
    bVar4 = 0;
  }
  else {
    bVar4 = 0;
    pAVar5 = area_first;
    local_2698 = pcVar3;
    local_2690 = ch;
    do {
      if ((pAVar5->area_flags[0] & 0x18) != 0) {
        local_2688[0] = pAVar5->name;
        local_2670.size_ = 0;
        local_2670._vptr_buffer = (_func_int **)&PTR_grow_00457340;
        local_2670.capacity_ = 500;
        format.size_ = 6;
        format.data_ = "%24s\n\r";
        args.field_1.values_ =
             (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_2688;
        args.desc_ = 0xc;
        local_2670.ptr_ = local_2650;
        fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                  (&local_2670,format,args);
        local_26b8[0] = local_26a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_26b8,local_2670.ptr_,local_2670.ptr_ + local_2670.size_);
        if (local_2670.ptr_ != local_2650) {
          operator_delete(local_2670.ptr_,local_2670.capacity_);
        }
        std::__cxx11::string::_M_append((char *)local_26d8,(ulong)local_26b8[0]);
        if (local_26b8[0] != local_26a8) {
          operator_delete(local_26b8[0],local_26a8[0] + 1);
        }
        bVar4 = 1;
      }
      pAVar5 = pAVar5->next;
      ch = local_2690;
      pcVar3 = local_2698;
    } while (pAVar5 != (AREA_DATA_conflict *)0x0);
  }
  bVar1 = str_cmp(pcVar3,"now");
  if ((bVar1) && (bVar1 = str_cmp(local_2458,"now"), (bVar1 & bVar4) == 1)) {
    send_to_char("The following areas have had changes made and need to be saved.  If you want\n\rto override, specify \'now\' after your reboot command.\n\r"
                 ,ch);
    send_to_char((char *)local_26d8[0],ch);
  }
  else {
    if ((rebooting & iVar2 != -1) == 0) {
      if (rebooting != false || -1 < iVar2) {
        rebooting = true;
        if (iVar2 == -1) {
          sprintf(local_1258,"{R%s has cancelled the reboot.{x",ch->true_name);
          do_immecho(ch,local_1258);
          reboot_num = -1;
          rebooting = false;
        }
        else if (iVar2 == 0) {
          reboot_now(ch);
        }
        else {
          reboot_num = iVar2;
          start_reboot(in_stack_ffffffffffffd918);
        }
        goto LAB_00271a71;
      }
      pcVar3 = "There is no reboot in progress to cancel.\n\r";
    }
    else {
      pcVar3 = "Someone has already started a reboot.\n\r";
    }
    send_to_char(pcVar3,ch);
  }
LAB_00271a71:
  if (local_26d8[0] != local_26c8) {
    operator_delete(local_26d8[0],local_26c8[0] + 1);
  }
  return;
}

Assistant:

void do_reboot(CHAR_DATA *ch, char *argument)
{
	int mins = 0;
	char send[MSL];
	char arg1[MSL];
	AREA_DATA *pArea = nullptr;
	bool found = false;

	argument = one_argument(argument, arg1);
	mins = atoi(arg1);

	std::string area = std::string("");
	for (pArea = area_first; pArea != nullptr; pArea = pArea->next)
	{
		if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
		{
			found = true;
			area += fmt::sprintf("%24s\n\r", pArea->name);
		}
	}

	if ((str_cmp(argument, "now") && str_cmp(arg1, "now")) && found)
	{
		send_to_char("The following areas have had changes made and need to be saved.  If you want\n\rto override, specify 'now' after your reboot command.\n\r", ch);
		send_to_char(area.c_str(), ch);
		return;
	}

	if (rebooting && mins != -1)
	{
		send_to_char("Someone has already started a reboot.\n\r", ch);
		return;
	}

	if (!rebooting && mins < 0)
	{
		send_to_char("There is no reboot in progress to cancel.\n\r", ch);
		return;
	}

	rebooting = true;

	if (mins == 0)
	{
		reboot_now(ch);
	}
	else if (mins == -1)
	{
		sprintf(send, "{R%s has cancelled the reboot.{x", ch->true_name);
		do_immecho(ch, send);
		reboot_num = -1;
		rebooting = false;
	}
	else
	{
		reboot_num = mins;
		start_reboot(ch);
	}
}